

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-term.c
# Opt level: O1

errr term_win_nuke(term_win *s)

{
  errr extraout_EAX;
  
  mem_free(s->a);
  mem_free(s->c);
  mem_free(s->va);
  mem_free(s->vc);
  mem_free(s->ta);
  mem_free(s->tc);
  mem_free(s->vta);
  mem_free(s->vtc);
  return extraout_EAX;
}

Assistant:

static errr term_win_nuke(term_win *s)
{
	/* Free the window access arrays */
	mem_free_alt(s->a);
	mem_free_alt(s->c);

	/* Free the window content arrays */
	mem_free_alt(s->va);
	mem_free_alt(s->vc);

	/* Free the terrain access arrays */
	mem_free_alt(s->ta);
	mem_free_alt(s->tc);

	/* Free the terrain content arrays */
	mem_free_alt(s->vta);
	mem_free_alt(s->vtc);

	/* Success */
	return (0);
}